

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O3

PointType __thiscall Bezier<3,_2>::at(Bezier<3,_2> *this,double *t,int *derivative_order)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  Curve<3,_2> CVar4;
  long lVar5;
  uint uVar6;
  int *in_RCX;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  double in_XMM1_Qa;
  double dVar11;
  PointType PVar12;
  PointsType temp;
  double local_58 [5];
  double dStack_30;
  double local_28;
  double dStack_20;
  
  iVar3 = *in_RCX;
  lVar5 = (long)iVar3;
  if (lVar5 < 4) {
    dVar2 = *(double *)derivative_order;
    in_XMM1_Qa = t[lVar5 * 8 + 2];
    local_28 = t[lVar5 * 8 + 8];
    dStack_20 = (t + lVar5 * 8 + 8)[1];
    local_58[4] = t[lVar5 * 8 + 6];
    dStack_30 = (t + lVar5 * 8 + 6)[1];
    local_58[2] = t[lVar5 * 8 + 4];
    local_58[3] = (t + lVar5 * 8 + 4)[1];
    local_58[0] = in_XMM1_Qa;
    local_58[1] = (t + lVar5 * 8 + 2)[1];
    if (iVar3 != 3) {
      dVar11 = 1.0;
      if (dVar2 <= 1.0) {
        dVar11 = dVar2;
      }
      dVar11 = (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar11);
      uVar6 = 3 - iVar3;
      in_XMM1_Qa = 1.0 - dVar11;
      uVar7 = 1;
      if (1 < (int)uVar6) {
        uVar7 = (ulong)uVar6;
      }
      uVar9 = 0;
      do {
        if ((long)uVar9 < (long)(int)uVar6) {
          lVar10 = 0;
          pdVar8 = local_58;
          do {
            if (lVar10 == 3) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Matrix<double, 2, 4>, 2, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 2, 4>, BlockRows = 2, BlockCols = 1, InnerPanel = true]"
                           );
            }
            pdVar1 = pdVar8 + 2;
            if ((((ulong)pdVar8 & 0xf) != 0) || (((ulong)pdVar1 & 0xf) != 0)) {
              __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                            ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                            "Eigen::internal::block_evaluator<Eigen::Matrix<double, 2, 4>, 2, 1, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<double, 2, 4>, BlockRows = 2, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                           );
            }
            lVar10 = lVar10 + 1;
            *pdVar8 = dVar11 * *pdVar1 + in_XMM1_Qa * *pdVar8;
            pdVar8[1] = dVar11 * pdVar8[3] + in_XMM1_Qa * pdVar8[1];
            pdVar8 = pdVar1;
          } while (lVar10 < (long)((long)(int)uVar6 - uVar9));
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar7);
    }
    dVar2 = (double)*(int *)((long)t + lVar5 * 4 + 0x110);
    local_58[0] = dVar2 * local_58[0];
    dVar2 = dVar2 * local_58[1];
    CVar4.length_._0_4_ = SUB84(dVar2,0);
    CVar4._vptr_Curve = (_func_int **)local_58[0];
    CVar4.length_._4_4_ = (int)((ulong)dVar2 >> 0x20);
    this->super_Curve<3,_2> = CVar4;
  }
  else {
    local_58[0] = 0.0;
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
  }
  PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       local_58[0];
  return (PointType)
         PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto at(const double& t, const int& derivative_order = 0) const -> PointType override {
    double t_ = std::clamp(t, 0.0, 1.0);

    if (derivative_order > N) {
      return PointType::Zero();
    }

    /// De Casteljau’s Algorithm ///
    PointsType temp = derivative_precal_points_[derivative_order];

    int I_range = N - derivative_order;
    for (int i = 0; i < I_range; ++i) {
      int J_range = I_range - i;
      for (int j = 0; j < J_range; ++j) {
        {
          temp.col(j) = (1.0 - t_) * temp.col(j) + t_ * temp.col(j + 1);
        }
      }
    }
    return derivative_precal_prefix_[derivative_order] * temp.col(0);
  }